

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__GetGlyphShapeTT(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  short sVar1;
  uchar *puVar2;
  stbtt_uint16 sVar3;
  stbtt_int16 sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  stbtt_uint8 *p;
  stbtt_vertex *psVar8;
  float fVar9;
  float fVar10;
  int local_114;
  int local_110;
  short y_1;
  short x_1;
  stbtt_vertex *v;
  float n_1;
  float m_1;
  float mtx [6];
  stbtt_vertex *tmp;
  stbtt_vertex *comp_verts;
  int local_c0;
  int i_1;
  int comp_num_verts;
  stbtt_uint16 gidx;
  stbtt_uint16 flags_1;
  stbtt_uint8 *comp;
  int more;
  stbtt_int16 dy;
  stbtt_int16 dx;
  stbtt_uint8 *points;
  stbtt_int32 scy;
  stbtt_int32 scx;
  stbtt_int32 sy;
  stbtt_int32 sx;
  stbtt_int32 cy;
  stbtt_int32 cx;
  stbtt_int32 y;
  stbtt_int32 x;
  stbtt_int32 start_off;
  stbtt_int32 off;
  stbtt_int32 was_off;
  stbtt_int32 next_move;
  stbtt_int32 n;
  stbtt_int32 m;
  stbtt_int32 j;
  stbtt_int32 i;
  stbtt_int32 ins;
  stbtt_uint8 flagcount;
  int iStack_54;
  stbtt_uint8 flags;
  int g;
  int num_vertices;
  stbtt_vertex *vertices;
  stbtt_uint8 *data;
  stbtt_uint8 *endPtsOfContours;
  stbtt_vertex **ppsStack_30;
  stbtt_int16 numberOfContours;
  stbtt_vertex **pvertices_local;
  stbtt_fontinfo *psStack_20;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  vertices = (stbtt_vertex *)info->data;
  _g = (stbtt_vertex *)0x0;
  iStack_54 = 0;
  ppsStack_30 = pvertices;
  pvertices_local._4_4_ = glyph_index;
  psStack_20 = info;
  ins = stbtt__GetGlyfOffset(info,glyph_index);
  *ppsStack_30 = (stbtt_vertex *)0x0;
  if (ins < 0) {
    info_local._4_4_ = 0;
  }
  else {
    endPtsOfContours._6_2_ = ttSHORT((stbtt_uint8 *)((long)&vertices->x + (long)ins));
    if (endPtsOfContours._6_2_ < 1) {
      if (endPtsOfContours._6_2_ < 0) {
        _comp_num_verts = (stbtt_uint8 *)((long)&vertices->cy1 + (long)ins);
        iStack_54 = 0;
        _g = (stbtt_vertex *)0x0;
        comp._0_4_ = 1;
        while ((uint)comp != 0) {
          local_c0 = 0;
          tmp = (stbtt_vertex *)0x0;
          n_1 = 1.0;
          m_1 = 0.0;
          mtx[0] = 0.0;
          mtx[1] = 1.0;
          i_1._2_2_ = ttSHORT(_comp_num_verts);
          _comp_num_verts = _comp_num_verts + 2;
          i_1._0_2_ = ttSHORT(_comp_num_verts);
          p = _comp_num_verts + 2;
          if ((i_1._2_2_ & 2) == 0) {
            _comp_num_verts = p;
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imstb_truetype.h"
                          ,0x733,
                          "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                         );
          }
          if ((i_1._2_2_ & 1) == 0) {
            iVar5 = (int)(char)*p;
            iVar6 = (int)(char)_comp_num_verts[3];
            _comp_num_verts = _comp_num_verts + 4;
          }
          else {
            _comp_num_verts = p;
            sVar4 = ttSHORT(p);
            iVar5 = (int)sVar4;
            _comp_num_verts = _comp_num_verts + 2;
            sVar4 = ttSHORT(_comp_num_verts);
            iVar6 = (int)sVar4;
            _comp_num_verts = _comp_num_verts + 2;
          }
          mtx[3] = (float)iVar6;
          mtx[2] = (float)iVar5;
          if ((i_1._2_2_ & 8) == 0) {
            if ((i_1._2_2_ & 0x40) == 0) {
              if ((i_1._2_2_ & 0x80) != 0) {
                sVar4 = ttSHORT(_comp_num_verts);
                n_1 = (float)(int)sVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
                sVar4 = ttSHORT(_comp_num_verts);
                m_1 = (float)(int)sVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
                sVar4 = ttSHORT(_comp_num_verts);
                mtx[0] = (float)(int)sVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
                sVar4 = ttSHORT(_comp_num_verts);
                mtx[1] = (float)(int)sVar4 / 16384.0;
                _comp_num_verts = _comp_num_verts + 2;
              }
            }
            else {
              sVar4 = ttSHORT(_comp_num_verts);
              n_1 = (float)(int)sVar4 / 16384.0;
              _comp_num_verts = _comp_num_verts + 2;
              m_1 = 0.0;
              sVar4 = ttSHORT(_comp_num_verts);
              mtx[1] = (float)(int)sVar4 / 16384.0;
              mtx[0] = 0.0;
              _comp_num_verts = _comp_num_verts + 2;
            }
          }
          else {
            sVar4 = ttSHORT(_comp_num_verts);
            n_1 = (float)(int)sVar4 / 16384.0;
            _comp_num_verts = _comp_num_verts + 2;
            mtx[0] = 0.0;
            m_1 = 0.0;
            mtx[1] = n_1;
          }
          fVar9 = sqrtf(n_1 * n_1 + m_1 * m_1);
          fVar10 = sqrtf(mtx[0] * mtx[0] + mtx[1] * mtx[1]);
          local_c0 = stbtt_GetGlyphShape(psStack_20,(uint)(ushort)i_1,&tmp);
          if (0 < local_c0) {
            for (comp_verts._4_4_ = 0; comp_verts._4_4_ < local_c0;
                comp_verts._4_4_ = comp_verts._4_4_ + 1) {
              psVar8 = tmp + comp_verts._4_4_;
              sVar1 = psVar8->x;
              psVar8->x = (short)(int)(fVar9 * (n_1 * (float)(int)sVar1 +
                                                mtx[0] * (float)(int)psVar8->y + mtx[2]));
              psVar8->y = (short)(int)(fVar10 * (m_1 * (float)(int)sVar1 +
                                                 mtx[1] * (float)(int)psVar8->y + mtx[3]));
              sVar1 = psVar8->cx;
              psVar8->cx = (short)(int)(fVar9 * (n_1 * (float)(int)sVar1 +
                                                 mtx[0] * (float)(int)psVar8->cy + mtx[2]));
              psVar8->cy = (short)(int)(fVar10 * (m_1 * (float)(int)sVar1 +
                                                  mtx[1] * (float)(int)psVar8->cy + mtx[3]));
            }
            psVar8 = (stbtt_vertex *)ImGui::MemAlloc((long)(iStack_54 + local_c0) * 0xe);
            if (psVar8 == (stbtt_vertex *)0x0) {
              if (_g != (stbtt_vertex *)0x0) {
                ImGui::MemFree(_g);
              }
              if (tmp != (stbtt_vertex *)0x0) {
                ImGui::MemFree(tmp);
              }
              return 0;
            }
            if ((0 < iStack_54) && (_g != (stbtt_vertex *)0x0)) {
              memcpy(psVar8,_g,(long)iStack_54 * 0xe);
            }
            memcpy(psVar8 + iStack_54,tmp,(long)local_c0 * 0xe);
            if (_g != (stbtt_vertex *)0x0) {
              ImGui::MemFree(_g);
            }
            _g = psVar8;
            ImGui::MemFree(tmp);
            iStack_54 = local_c0 + iStack_54;
          }
          comp._0_4_ = i_1._2_2_ & 0x20;
        }
      }
    }
    else {
      i._3_1_ = 0;
      n = 0;
      start_off = 0;
      y = 0;
      data = (stbtt_uint8 *)((long)&vertices->cy1 + (long)ins);
      sVar3 = ttUSHORT((stbtt_uint8 *)
                       ((long)&vertices->cy1 + (long)((int)endPtsOfContours._6_2_ << 1) + (long)ins)
                      );
      j = (stbtt_int32)sVar3;
      _more = &vertices->type + (long)j + (long)((int)endPtsOfContours._6_2_ << 1) + (long)ins;
      sVar3 = ttUSHORT(data + (long)((int)endPtsOfContours._6_2_ << 1) + -2);
      was_off = sVar3 + 1;
      next_move = was_off + endPtsOfContours._6_2_ * 2;
      _g = (stbtt_vertex *)ImGui::MemAlloc((long)next_move * 0xe);
      if (_g == (stbtt_vertex *)0x0) {
        return 0;
      }
      off = 0;
      i._2_1_ = 0;
      x = next_move - was_off;
      for (m = 0; m < was_off; m = m + 1) {
        if (i._2_1_ == 0) {
          i._3_1_ = *_more;
          puVar2 = _more + 1;
          if ((i._3_1_ & 8) != 0) {
            i._2_1_ = _more[1];
            puVar2 = _more + 2;
          }
        }
        else {
          i._2_1_ = i._2_1_ - 1;
          puVar2 = _more;
        }
        _more = puVar2;
        _g[x + m].type = i._3_1_;
      }
      cx = 0;
      for (m = 0; m < was_off; m = m + 1) {
        i._3_1_ = _g[x + m].type;
        if ((i._3_1_ & 2) == 0) {
          if ((i._3_1_ & 0x10) == 0) {
            cx = cx + (short)((ushort)*_more * 0x100 + (ushort)_more[1]);
            _more = _more + 2;
          }
        }
        else {
          comp._6_2_ = (ushort)*_more;
          if ((i._3_1_ & 0x10) == 0) {
            local_110 = -(int)(short)comp._6_2_;
          }
          else {
            local_110 = (int)(short)comp._6_2_;
          }
          cx = local_110 + cx;
          _more = _more + 1;
        }
        _g[x + m].x = (short)cx;
      }
      cy = 0;
      for (m = 0; m < was_off; m = m + 1) {
        i._3_1_ = _g[x + m].type;
        if ((i._3_1_ & 4) == 0) {
          if ((i._3_1_ & 0x20) == 0) {
            cy = cy + (short)((ushort)*_more * 0x100 + (ushort)_more[1]);
            _more = _more + 2;
          }
        }
        else {
          comp._4_2_ = (ushort)*_more;
          if ((i._3_1_ & 0x20) == 0) {
            local_114 = -(int)(short)comp._4_2_;
          }
          else {
            local_114 = (int)(short)comp._4_2_;
          }
          cy = local_114 + cy;
          _more = _more + 1;
        }
        _g[x + m].y = (short)cy;
      }
      iStack_54 = 0;
      points._0_4_ = 0;
      points._4_4_ = 0;
      sy = 0;
      sx = 0;
      scy = 0;
      scx = 0;
      for (m = 0; m < was_off; m = m + 1) {
        i._3_1_ = _g[x + m].type;
        cx = (stbtt_int32)_g[x + m].x;
        cy = (stbtt_int32)_g[x + m].y;
        if (off == m) {
          if (m != 0) {
            iStack_54 = stbtt__close_shape(_g,iStack_54,start_off,y,scx,scy,points._4_4_,
                                           (stbtt_int32)points,sx,sy);
          }
          y = (stbtt_int32)(((i._3_1_ & 1) != 0 ^ 0xffU) & 1);
          if (y == 0) {
            scx = cx;
            scy = cy;
          }
          else {
            points._4_4_ = cx;
            points._0_4_ = cy;
            if ((_g[x + m + 1].type & 1) == 0) {
              scx = cx + _g[x + m + 1].x >> 1;
              scy = cy + _g[x + m + 1].y >> 1;
            }
            else {
              scx = (stbtt_int32)_g[x + m + 1].x;
              scy = (stbtt_int32)_g[x + m + 1].y;
              m = m + 1;
            }
          }
          lVar7 = (long)iStack_54;
          iStack_54 = iStack_54 + 1;
          stbtt_setvertex(_g + lVar7,'\x01',scx,scy,0,0);
          start_off = 0;
          sVar3 = ttUSHORT(data + (n << 1));
          off = sVar3 + 1;
          n = n + 1;
        }
        else if ((i._3_1_ & 1) == 0) {
          if (start_off != 0) {
            lVar7 = (long)iStack_54;
            iStack_54 = iStack_54 + 1;
            stbtt_setvertex(_g + lVar7,'\x03',sx + cx >> 1,sy + cy >> 1,sx,sy);
          }
          sx = cx;
          sy = cy;
          start_off = 1;
        }
        else {
          if (start_off == 0) {
            lVar7 = (long)iStack_54;
            iStack_54 = iStack_54 + 1;
            stbtt_setvertex(_g + lVar7,'\x02',cx,cy,0,0);
          }
          else {
            lVar7 = (long)iStack_54;
            iStack_54 = iStack_54 + 1;
            stbtt_setvertex(_g + lVar7,'\x03',cx,cy,sx,sy);
          }
          start_off = 0;
        }
      }
      iStack_54 = stbtt__close_shape(_g,iStack_54,start_off,y,scx,scy,points._4_4_,
                                     (stbtt_int32)points,sx,sy);
    }
    *ppsStack_30 = _g;
    info_local._4_4_ = iStack_54;
  }
  return info_local._4_4_;
}

Assistant:

static int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours < 0) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;

         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }

         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0 && vertices) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}